

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O0

void __thiscall
Patch::Node::write_dot_graph
          (Node *this,stringstream *result,Point left_ancestor_old_end,Point left_ancestor_new_end)

{
  bool bVar1;
  ostream *poVar2;
  type pTVar3;
  void *pvVar4;
  Point local_48;
  Point node_new_end;
  Point node_old_end;
  Point node_new_start;
  Point node_old_start;
  stringstream *result_local;
  Node *this_local;
  Point left_ancestor_new_end_local;
  Point left_ancestor_old_end_local;
  
  this_local = (Node *)left_ancestor_new_end;
  left_ancestor_new_end_local = left_ancestor_old_end;
  node_new_start =
       Point::traverse(&left_ancestor_new_end_local,&this->old_distance_from_left_ancestor);
  node_old_end = Point::traverse((Point *)&this_local,&this->new_distance_from_left_ancestor);
  node_new_end = Point::traverse(&node_new_start,&this->old_extent);
  local_48 = Point::traverse(&node_old_end,&this->new_extent);
  poVar2 = std::operator<<((ostream *)(result + 0x10),"node_");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this);
  poVar2 = std::operator<<(poVar2," [");
  poVar2 = std::operator<<(poVar2,"label=\"");
  poVar2 = std::operator<<(poVar2,"new range: ");
  poVar2 = ::operator<<(poVar2,&node_old_end);
  poVar2 = std::operator<<(poVar2," - ");
  poVar2 = ::operator<<(poVar2,&local_48);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"old range: ");
  poVar2 = ::operator<<(poVar2,&node_new_start);
  poVar2 = std::operator<<(poVar2," - ");
  poVar2 = ::operator<<(poVar2,&node_new_end);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar2,"new text: ");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->new_text);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)(result + 0x10),"\\\"");
    pTVar3 = std::unique_ptr<Text,_std::default_delete<Text>_>::operator*(&this->new_text);
    poVar2 = ::operator<<(poVar2,pTVar3);
    poVar2 = std::operator<<(poVar2,"\\\"");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)(result + 0x10),"null");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<((ostream *)(result + 0x10),"old text: ");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->old_text);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)(result + 0x10),"\\\"");
    pTVar3 = std::unique_ptr<Text,_std::default_delete<Text>_>::operator*(&this->old_text);
    poVar2 = ::operator<<(poVar2,pTVar3);
    poVar2 = std::operator<<(poVar2,"\\\"");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)(result + 0x10),"null");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)(result + 0x10),"old text size:");
    pvVar4 = (void *)std::ostream::operator<<(poVar2,this->old_text_size_);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  }
  poVar2 = std::operator<<((ostream *)(result + 0x10),"old_subtree_text_size: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar2,this->old_subtree_text_size);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)(result + 0x10),"new_subtree_text_size: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar2,this->new_subtree_text_size);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)(result + 0x10),"\"");
  poVar2 = std::operator<<(poVar2,"tooltip=\"");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this);
  poVar2 = std::operator<<(poVar2,"\"]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)(result + 0x10),"node_");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this);
  std::operator<<(poVar2," -> ");
  if (this->left == (Node *)0x0) {
    poVar2 = std::operator<<((ostream *)(result + 0x10),"node_");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this);
    poVar2 = std::operator<<(poVar2,"_left_null");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)(result + 0x10),"node_");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this);
    poVar2 = std::operator<<(poVar2,"_left_null [label=\"\" shape=point]");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)(result + 0x10),"node_");
    pvVar4 = (void *)std::ostream::operator<<(poVar2,this->left);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    write_dot_graph(this->left,result,left_ancestor_new_end_local,(Point)this_local);
  }
  poVar2 = std::operator<<((ostream *)(result + 0x10),"node_");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this);
  std::operator<<(poVar2," -> ");
  if (this->right == (Node *)0x0) {
    poVar2 = std::operator<<((ostream *)(result + 0x10),"node_");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this);
    poVar2 = std::operator<<(poVar2,"_right_null");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)(result + 0x10),"node_");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this);
    poVar2 = std::operator<<(poVar2,"_right_null [label=\"\" shape=point]");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)(result + 0x10),"node_");
    pvVar4 = (void *)std::ostream::operator<<(poVar2,this->right);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    write_dot_graph(this->right,result,node_new_end,local_48);
  }
  return;
}

Assistant:

void write_dot_graph(std::stringstream &result, Point left_ancestor_old_end, Point left_ancestor_new_end) {
    Point node_old_start = left_ancestor_old_end.traverse(old_distance_from_left_ancestor);
    Point node_new_start = left_ancestor_new_end.traverse(new_distance_from_left_ancestor);
    Point node_old_end = node_old_start.traverse(old_extent);
    Point node_new_end = node_new_start.traverse(new_extent);

    result << "node_" << this << " ["
      << "label=\""
      << "new range: " << node_new_start << " - " << node_new_end << ", " << endl
      << "old range: " << node_old_start << " - " << node_old_end << ", " << endl
      << "new text: ";

    if (new_text) {
      result << "\\\"" << *new_text << "\\\"" << endl;
    } else {
      result << "null" << endl;
    }

    result << "old text: ";
    if (old_text) {
      result << "\\\"" << *old_text <<  "\\\""  << endl;
    } else {
      result << "null" << endl;
      result << "old text size:" << old_text_size_ << endl;
    }

    result << "old_subtree_text_size: " << old_subtree_text_size << endl;
    result << "new_subtree_text_size: " << new_subtree_text_size << endl;

    result << "\""
      << "tooltip=\"" << this
      << "\"]" << endl;

    result << "node_" << this << " -> ";
    if (left) {
      result << "node_" << left << endl;
      left->write_dot_graph(result, left_ancestor_old_end, left_ancestor_new_end);
    } else {
      result << "node_" << this << "_left_null" << endl;
      result << "node_" << this << "_left_null [label=\"\" shape=point]" << endl;
    }

    result << "node_" << this << " -> ";
    if (right) {
      result << "node_" << right << endl;
      right->write_dot_graph(result, node_old_end, node_new_end);
    } else {
      result << "node_" << this << "_right_null" << endl;
      result << "node_" << this << "_right_null [label=\"\" shape=point]" << endl;
    }
  }